

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cc
# Opt level: O0

void ipx::dump<std::__cxx11::string>
               (ostream *os,char *name,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value)

{
  ostream *poVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  ostream *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_000000e8;
  char *in_stack_ffffffffffffff50;
  allocator local_79;
  string local_78 [32];
  string local_58 [32];
  string local_38 [56];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"info.",&local_79);
  std::operator+(in_RDX,in_stack_ffffffffffffff50);
  Textline<std::__cxx11::string>(in_stack_000000e8);
  poVar1 = std::operator<<(in_RDI,local_38);
  poVar1 = std::operator<<(poVar1,(string *)in_RDX);
  std::operator<<(poVar1,'\n');
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  return;
}

Assistant:

static void dump(std::ostream& os, const char* name, T value) {
    os << Textline(std::string("info.")+name) << value << '\n';
}